

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O3

int tnt_reload_schema(tnt_stream *s)

{
  anon_union_128_3_89b29c27_for_data *r_00;
  void *pvVar1;
  uint32_t reqid;
  int iVar2;
  long lVar3;
  tnt_reply *r;
  anon_union_128_3_89b29c27_for_data *paVar4;
  undefined8 *puVar5;
  uint uVar6;
  byte bVar7;
  undefined1 local_150 [8];
  tnt_reply bkp;
  tnt_iter it;
  
  bVar7 = 0;
  pvVar1 = s->data;
  iVar2 = -1;
  if ((*(int *)((long)pvVar1 + 0x78) != 0) && (s->wrcnt == 0)) {
    reqid = tnt_stream_reqid(s,0x7f);
    tnt_get_space(s);
    tnt_get_index(s);
    tnt_stream_reqid(s,reqid);
    tnt_io_flush((tnt_stream_net *)s->data);
    tnt_iter_reply((tnt_iter *)&bkp.sqlinfo_end,s);
    tnt_reply_init((tnt_reply *)local_150);
    iVar2 = tnt_next((tnt_iter *)&bkp.sqlinfo_end);
    uVar6 = 0;
    if (iVar2 != 0) {
      r_00 = &it.data;
      do {
        if (it.data.map.value_end == (char *)0x80) {
          if (it.data.reply.r.schema_id != 0) goto LAB_00108cbf;
          if ((uVar6 & 1) == 0) {
            paVar4 = r_00;
            puVar5 = (undefined8 *)local_150;
            for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
              *puVar5 = (paVar4->array).data;
              paVar4 = (anon_union_128_3_89b29c27_for_data *)
                       ((long)paVar4 + (ulong)bVar7 * -0x10 + 8);
              puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
            }
            it.data.array.elem = (char *)0x0;
          }
          else {
            uVar6 = uVar6 + 2;
            tnt_schema_add_indexes(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)&r_00->array)
            ;
          }
        }
        else {
          if ((it.data.map.value_end != (char *)0x7f) || (it.data.reply.r.schema_id != 0))
          goto LAB_00108cbf;
          tnt_schema_add_spaces(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)&r_00->array);
          uVar6 = uVar6 + 1;
        }
        iVar2 = tnt_next((tnt_iter *)&bkp.sqlinfo_end);
      } while (iVar2 != 0);
    }
    if (bkp.bitmap != 0) {
      tnt_schema_add_indexes(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)local_150);
      uVar6 = uVar6 + 2;
      tnt_reply_free((tnt_reply *)local_150);
    }
    iVar2 = 0;
    if (uVar6 != 3) {
LAB_00108cbf:
      iVar2 = -1;
    }
    tnt_iter_free((tnt_iter *)&bkp.sqlinfo_end);
  }
  return iVar2;
}

Assistant:

int tnt_reload_schema(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (!sn->connected || pm_atomic_load(&s->wrcnt) != 0)
		return -1;
	uint64_t oldsync = tnt_stream_reqid(s, 127);
	tnt_get_space(s);
	tnt_get_index(s);
	tnt_stream_reqid(s, oldsync);
	tnt_flush(s);
	struct tnt_iter it; tnt_iter_reply(&it, s);
	struct tnt_reply bkp; tnt_reply_init(&bkp);
	int sloaded = 0;
	while (tnt_next(&it)) {
		struct tnt_reply *r = TNT_IREPLY_PTR(&it);
		switch (r->sync) {
		case(127):
			if (r->error)
				goto error;
			tnt_schema_add_spaces(sn->schema, r);
			sloaded += 1;
			break;
		case(128):
			if (r->error)
				goto error;
			if (!(sloaded & 1)) {
				memcpy(&bkp, r, sizeof(struct tnt_reply));
				r->buf = NULL;
				break;
			}
			sloaded += 2;
			tnt_schema_add_indexes(sn->schema, r);
			break;
		default:
			goto error;
		}
	}
	if (bkp.buf) {
		tnt_schema_add_indexes(sn->schema, &bkp);
		sloaded += 2;
		tnt_reply_free(&bkp);
	}
	if (sloaded != 3) goto error;

	tnt_iter_free(&it);
	return 0;
error:
	tnt_iter_free(&it);
	return -1;
}